

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O3

void key_schedule_transform_post_ch1hash(ptls_key_schedule_t *sched)

{
  size_t sVar1;
  ptls_hash_context_t **pppVar2;
  ptls_hash_context_t *ppVar3;
  uint8_t ch1hash [64];
  undefined2 local_8c;
  undefined1 local_8a;
  undefined1 local_89;
  ptls_hash_context_t *local_88;
  ptls_hash_context_t *appStack_80 [3];
  undefined1 local_68 [64];
  
  sVar1 = (sched->hashes[0].algo)->digest_size;
  ppVar3 = sched->hashes[0].ctx;
  local_88 = sched->hashes[0].ctx;
  appStack_80[0] = sched->hashes[0].ctx_outer;
  appStack_80[1] = (ptls_hash_context_t *)0x0;
  local_8c = 0xfe;
  local_8a = 0;
  local_89 = (undefined1)sVar1;
  if (ppVar3 != (ptls_hash_context_t *)0x0) {
    pppVar2 = appStack_80;
    do {
      (*ppVar3->final)(ppVar3,local_68,PTLS_HASH_FINAL_MODE_RESET);
      (*ppVar3->update)(ppVar3,&local_8c,4);
      (*ppVar3->update)(ppVar3,local_68,sVar1);
      ppVar3 = *pppVar2;
      pppVar2 = pppVar2 + 1;
    } while (ppVar3 != (ptls_hash_context_t *)0x0);
  }
  (*ptls_clear_memory)(local_68,0x40);
  return;
}

Assistant:

static void key_schedule_transform_post_ch1hash(ptls_key_schedule_t *sched)
{
    size_t digest_size = sched->hashes[0].algo->digest_size;
    ptls_hash_context_t *hashes[3] = {sched->hashes[0].ctx, sched->hashes[0].ctx_outer, NULL};
    uint8_t ch1hash[PTLS_MAX_DIGEST_SIZE];
    uint8_t prefix[4] = {PTLS_HANDSHAKE_TYPE_MESSAGE_HASH, 0, 0, (uint8_t)digest_size};

    for (size_t i = 0; hashes[i] != NULL; ++i) {
        hashes[i]->final(hashes[i], ch1hash, PTLS_HASH_FINAL_MODE_RESET);
        hashes[i]->update(hashes[i], prefix, sizeof(prefix));
        hashes[i]->update(hashes[i], ch1hash, digest_size);
    }

    ptls_clear_memory(ch1hash, sizeof(ch1hash));
}